

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariantanimation_p.h
# Opt level: O3

QVariant *
_q_interpolateVariant<QLineF>
          (QVariant *__return_storage_ptr__,QLineF *from,QLineF *to,qreal progress)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  QLineF l;
  long in_FS_OFFSET;
  
  dVar1 = (from->pt1).xp;
  dVar2 = (from->pt1).yp;
  dVar3 = (from->pt2).xp;
  dVar4 = (from->pt2).yp;
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    l.pt1.yp = ((to->pt1).yp - dVar2) * progress + dVar2;
    l.pt1.xp = ((to->pt1).xp - dVar1) * progress + dVar1;
    l.pt2.xp = ((to->pt2).xp - dVar3) * progress + dVar3;
    l.pt2.yp = ((to->pt2).yp - dVar4) * progress + dVar4;
    QVariant::QVariant(__return_storage_ptr__,l);
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

inline QVariant _q_interpolateVariant(const T &from, const T &to, qreal progress)
{
    return _q_interpolate(from, to, progress);
}